

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O2

int decoder_get_raw_buffer_value(ndn_decoder_t *decoder,uint8_t *value,uint32_t size)

{
  if ((int)(decoder->input_size - decoder->offset) < (int)size) {
    return -10;
  }
  memcpy(value,decoder->input_value + decoder->offset,(ulong)size);
  decoder->offset = decoder->offset + size;
  return 0;
}

Assistant:

static inline int
decoder_get_raw_buffer_value(ndn_decoder_t* decoder, uint8_t* value, uint32_t size)
{
  int rest_length = decoder->input_size - decoder->offset;
  if (rest_length < (int) size) {
    return NDN_OVERSIZE;
  }
  memcpy(value, decoder->input_value + decoder->offset, size);
  decoder->offset += size;
  return 0;
}